

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O1

void mpr_print_n1_set(nhdp_domain *domain,avl_tree *set)

{
  int iVar1;
  list_entity *plVar2;
  oonf_log_source source;
  char *pcVar3;
  list_entity *plVar4;
  netaddr_str buf1;
  
  plVar4 = (set->list_head).next;
  if (plVar4->prev != (set->list_head).prev) {
    do {
      source = LOG_MPR;
      if ((log_global_mask[LOG_MPR] & 1) != 0) {
        plVar2 = plVar4[-1].prev;
        iVar1 = domain->index;
        pcVar3 = netaddr_to_prefixstring(&buf1,(netaddr *)&plVar4[-3].prev,false);
        oonf_log(LOG_SEVERITY_DEBUG,source,"src/nhdp/mpr/neighbor-graph.c",0xf2,(void *)0x0,0,
                 "%s in: %u out: %u",pcVar3,(ulong)*(uint *)&plVar2[(long)iVar1 * 2 + 0xe].next,
                 (ulong)*(uint *)((long)&plVar2[(long)iVar1 * 2 + 0xe].next + 4));
      }
      plVar4 = plVar4->next;
    } while (plVar4->prev != (set->list_head).prev);
  }
  return;
}

Assistant:

void
mpr_print_n1_set(struct nhdp_domain *domain __attribute__((unused)), struct avl_tree *set) {
  struct n1_node *current_node;
#ifdef OONF_LOG_DEBUG_INFO
  struct nhdp_neighbor_domaindata *neighbordata;
  struct netaddr_str buf1;
#endif

  avl_for_each_element(set, current_node, _avl_node) {
#ifdef OONF_LOG_DEBUG_INFO
    neighbordata = nhdp_domain_get_neighbordata(domain, current_node->neigh);

    OONF_DEBUG(LOG_MPR, "%s in: %u out: %u", netaddr_to_string(&buf1, &current_node->addr), neighbordata->metric.in,
      neighbordata->metric.out);
#endif
  }
}